

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

bool __thiscall QProcessPrivate::openChannelsForDetached(QProcessPrivate *this)

{
  bool bVar1;
  char *in_RDI;
  long in_FS_OFFSET;
  byte bVar2;
  QProcessPrivate *unaff_retaddr;
  bool needToOpen;
  char *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  int line;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 uVar3;
  bool local_69;
  QMessageLogger local_68;
  QMessageLogger local_48;
  QMessageLogger local_28;
  Channel *channel;
  
  channel = *(Channel **)(in_FS_OFFSET + 0x28);
  uVar3 = true;
  if (in_RDI[0x1b8] != '\x03') {
    uVar3 = in_RDI[0x1b8] == '\x02';
  }
  bVar2 = uVar3;
  if ((in_RDI[0x1b8] != '\0') && (((bool)uVar3 == false || (in_RDI[0x2a8] == '\x01')))) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(uVar3,CONCAT16(uVar3,in_stack_ffffffffffffff80)),in_RDI,
               in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
    QMessageLogger::warning
              (&local_28,
               "QProcess::openChannelsForDetached: Inconsistent stdin channel configuration");
  }
  if ((bVar2 & 1) != 0) {
    bVar1 = openChannel(unaff_retaddr,channel);
    if (!bVar1) {
      local_69 = false;
      goto LAB_0078ff27;
    }
  }
  line = CONCAT13(1,(int3)in_stack_ffffffffffffff74);
  if (in_RDI[0x1f0] != '\x03') {
    line = CONCAT13(in_RDI[0x1f0] == '\x01',(int3)in_stack_ffffffffffffff74);
  }
  bVar2 = (byte)((uint)line >> 0x18);
  if ((in_RDI[0x1f0] != '\0') &&
     (((bVar2 == 0 || (in_RDI[0x2a7] == '\x02')) || (in_RDI[0x2a7] == '\x03')))) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(bVar2,CONCAT16(uVar3,in_stack_ffffffffffffff80)),in_RDI,
               line,in_stack_ffffffffffffff68);
    QMessageLogger::warning
              (&local_48,
               "QProcess::openChannelsForDetached: Inconsistent stdout channel configuration");
  }
  if ((bVar2 & 1) != 0) {
    bVar1 = openChannel(unaff_retaddr,channel);
    if (!bVar1) {
      local_69 = false;
      goto LAB_0078ff27;
    }
  }
  bVar2 = in_RDI[0x228] == '\x03';
  if ((in_RDI[0x228] != '\0') &&
     (((!(bool)bVar2 || (in_RDI[0x2a7] == '\x02')) ||
      ((in_RDI[0x2a7] == '\x04' || (in_RDI[0x2a7] == '\x01')))))) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(bVar2,CONCAT16(uVar3,in_stack_ffffffffffffff80)),in_RDI,
               line,in_stack_ffffffffffffff68);
    QMessageLogger::warning
              (&local_68,
               "QProcess::openChannelsForDetached: Inconsistent stderr channel configuration");
  }
  if ((bVar2 & 1) != 0) {
    bVar1 = openChannel(unaff_retaddr,channel);
    if (!bVar1) {
      local_69 = false;
      goto LAB_0078ff27;
    }
  }
  local_69 = true;
LAB_0078ff27:
  if (*(Channel **)(in_FS_OFFSET + 0x28) == channel) {
    return local_69;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::openChannelsForDetached()
{
    // stdin channel.
    bool needToOpen = (stdinChannel.type == Channel::Redirect
                       || stdinChannel.type == Channel::PipeSink);
    if (stdinChannel.type != Channel::Normal
            && (!needToOpen
                || inputChannelMode == QProcess::ForwardedInputChannel)) {
        qWarning("QProcess::openChannelsForDetached: Inconsistent stdin channel configuration");
    }
    if (needToOpen && !openChannel(stdinChannel))
        return false;

    // stdout channel.
    needToOpen = (stdoutChannel.type == Channel::Redirect
                  || stdoutChannel.type == Channel::PipeSource);
    if (stdoutChannel.type != Channel::Normal
            && (!needToOpen
                || processChannelMode == QProcess::ForwardedChannels
                || processChannelMode == QProcess::ForwardedOutputChannel)) {
        qWarning("QProcess::openChannelsForDetached: Inconsistent stdout channel configuration");
    }
    if (needToOpen && !openChannel(stdoutChannel))
        return false;

    // stderr channel.
    needToOpen = (stderrChannel.type == Channel::Redirect);
    if (stderrChannel.type != Channel::Normal
            && (!needToOpen
                || processChannelMode == QProcess::ForwardedChannels
                || processChannelMode == QProcess::ForwardedErrorChannel
                || processChannelMode == QProcess::MergedChannels)) {
        qWarning("QProcess::openChannelsForDetached: Inconsistent stderr channel configuration");
    }
    if (needToOpen && !openChannel(stderrChannel))
        return false;

    return true;
}